

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeLoad<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,Type type,bool signed_,int bytes,bool isAtomic)

{
  __index_type *__return_storage_ptr___00;
  Name *mem_00;
  Memarg *pMVar1;
  bool bVar2;
  Err local_148;
  Err *local_128;
  Err *err_1;
  Result<wasm::WATParser::Memarg> _val_1;
  Result<wasm::WATParser::Memarg> arg;
  Err local_c8;
  Err *local_a8;
  Err *err;
  undefined1 local_90 [8];
  MaybeResult<wasm::Name> _val;
  MaybeResult<wasm::Name> mem;
  bool isAtomic_local;
  bool signed__local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *ctx_local;
  Type type_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20);
  maybeMemidx<wasm::WATParser::ParseDefsCtx>
            ((MaybeResult<wasm::Name> *)__return_storage_ptr___00,ctx);
  MaybeResult<wasm::Name>::MaybeResult
            ((MaybeResult<wasm::Name> *)local_90,
             (MaybeResult<wasm::Name> *)__return_storage_ptr___00);
  local_a8 = MaybeResult<wasm::Name>::getErr((MaybeResult<wasm::Name> *)local_90);
  bVar2 = local_a8 == (Err *)0x0;
  if (!bVar2) {
    wasm::Err::Err(&local_c8,local_a8);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_c8);
    wasm::Err::~Err(&local_c8);
  }
  MaybeResult<wasm::Name>::~MaybeResult((MaybeResult<wasm::Name> *)local_90);
  if (bVar2) {
    memarg<wasm::WATParser::ParseDefsCtx>
              ((Result<wasm::WATParser::Memarg> *)
               ((long)&_val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> + 0x20),ctx,bytes)
    ;
    Result<wasm::WATParser::Memarg>::Result
              ((Result<wasm::WATParser::Memarg> *)&err_1,
               (Result<wasm::WATParser::Memarg> *)
               ((long)&_val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> + 0x20));
    local_128 = Result<wasm::WATParser::Memarg>::getErr((Result<wasm::WATParser::Memarg> *)&err_1);
    bVar2 = local_128 == (Err *)0x0;
    if (!bVar2) {
      wasm::Err::Err(&local_148,local_128);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_148);
      wasm::Err::~Err(&local_148);
    }
    Result<wasm::WATParser::Memarg>::~Result((Result<wasm::WATParser::Memarg> *)&err_1);
    if (bVar2) {
      mem_00 = MaybeResult<wasm::Name>::getPtr
                         ((MaybeResult<wasm::Name> *)
                          ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20))
      ;
      pMVar1 = Result<wasm::WATParser::Memarg>::operator*
                         ((Result<wasm::WATParser::Memarg> *)
                          ((long)&_val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>
                                  .super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> + 0x20)
                         );
      ParseDefsCtx::makeLoad
                (__return_storage_ptr__,ctx,pos,annotations,type,signed_,bytes,isAtomic,mem_00,
                 *pMVar1);
    }
    Result<wasm::WATParser::Memarg>::~Result
              ((Result<wasm::WATParser::Memarg> *)
               ((long)&_val_1.val.super__Variant_base<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_assign_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Move_ctor_alias<wasm::WATParser::Memarg,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::Memarg,_wasm::Err> + 0x20));
  }
  MaybeResult<wasm::Name>::~MaybeResult
            ((MaybeResult<wasm::Name> *)
             ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> makeLoad(Ctx& ctx,
                  Index pos,
                  const std::vector<Annotation>& annotations,
                  Type type,
                  bool signed_,
                  int bytes,
                  bool isAtomic) {
  auto mem = maybeMemidx(ctx);
  CHECK_ERR(mem);
  auto arg = memarg(ctx, bytes);
  CHECK_ERR(arg);
  return ctx.makeLoad(
    pos, annotations, type, signed_, bytes, isAtomic, mem.getPtr(), *arg);
}